

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile_example.c
# Opt level: O3

void print_size(FILE *_fp,opus_int64 _nbytes,int _metric,char *_spacer)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char *__format;
  uint uVar7;
  ulong uVar8;
  
  lVar2 = 1000;
  if (_metric == 0) {
    lVar2 = 0x400;
  }
  uVar7 = 0;
  uVar8 = 0;
  uVar5 = 1;
  do {
    uVar4 = uVar5 * lVar2;
    if (_nbytes < (long)(uVar4 - uVar8)) goto LAB_00109a9e;
    uVar8 = uVar4 >> 1;
    uVar7 = uVar7 + 1;
    uVar5 = uVar4;
  } while (uVar7 != 6);
  uVar7 = 6;
LAB_00109a9e:
  lVar2 = (long)(uVar8 + _nbytes) / (long)uVar5;
  if (lVar2 < 10 && 1 < uVar5) {
    if (uVar5 < 1000000000) {
      lVar2 = uVar8 + _nbytes * 100;
    }
    else {
      lVar2 = _nbytes + uVar8 / 100;
      uVar5 = uVar5 / 100;
    }
    lVar6 = (lVar2 / (long)uVar5) / 100;
    uVar3 = (int)(lVar2 / (long)uVar5) + (int)lVar6 * -100;
    cVar1 = " kMGTPE"[uVar7];
    __format = "%li.%02i%s%c";
  }
  else {
    if (99 < lVar2 || uVar5 < 2) {
      fprintf((FILE *)_fp,"%li%s%c",lVar2,_spacer,(ulong)(uint)(int)" kMGTPE"[uVar7]);
      return;
    }
    if (uVar5 < 1000000000) {
      lVar2 = uVar8 + _nbytes * 10;
    }
    else {
      lVar2 = _nbytes + uVar8 / 10;
      uVar5 = uVar5 / 10;
    }
    lVar6 = (lVar2 / (long)uVar5) / 10;
    uVar3 = (int)(lVar2 / (long)uVar5) + (int)lVar6 * -10;
    cVar1 = " kMGTPE"[uVar7];
    __format = "%li.%i%s%c";
  }
  fprintf((FILE *)_fp,__format,lVar6,(ulong)uVar3,_spacer,(ulong)(uint)(int)cVar1);
  return;
}

Assistant:

static void print_size(FILE *_fp,opus_int64 _nbytes,int _metric,
 const char *_spacer){
  static const char SUFFIXES[7]={' ','k','M','G','T','P','E'};
  opus_int64 val;
  opus_int64 den;
  opus_int64 round;
  int        base;
  int        shift;
  base=_metric?1000:1024;
  round=0;
  den=1;
  for(shift=0;shift<6;shift++){
    if(_nbytes<den*base-round)break;
    den*=base;
    round=den>>1;
  }
  val=(_nbytes+round)/den;
  if(den>1&&val<10){
    if(den>=1000000000)val=(_nbytes+(round/100))/(den/100);
    else val=(_nbytes*100+round)/den;
    fprintf(_fp,"%li.%02i%s%c",(long)(val/100),(int)(val%100),
     _spacer,SUFFIXES[shift]);
  }
  else if(den>1&&val<100){
    if(den>=1000000000)val=(_nbytes+(round/10))/(den/10);
    else val=(_nbytes*10+round)/den;
    fprintf(_fp,"%li.%i%s%c",(long)(val/10),(int)(val%10),
     _spacer,SUFFIXES[shift]);
  }
  else fprintf(_fp,"%li%s%c",(long)val,_spacer,SUFFIXES[shift]);
}